

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

MemoryRegion *
memory_map_ptr_ppc64(uc_struct_conflict11 *uc,hwaddr begin,size_t size,uint32_t perms,void *ptr)

{
  MemoryRegion *mr;
  MemoryRegion *mr_00;
  
  mr_00 = (MemoryRegion *)g_malloc(0xa0);
  memory_region_init_ram_ptr_ppc64(uc,mr_00,size,ptr);
  mr_00->perms = perms;
  if ((mr_00->addr == 0xffffffffffffffff) || (mr_00->ram_block == (RAMBlock *)0x0)) {
    g_free(mr_00);
    mr_00 = (MemoryRegion *)0x0;
  }
  else {
    mr = uc->system_memory;
    mr_00->priority = 0;
    memory_region_add_subregion_common(mr,begin,mr_00);
    if (uc->cpu != (CPUState *)0x0) {
      tlb_flush_ppc64(uc->cpu);
    }
  }
  return mr_00;
}

Assistant:

MemoryRegion *memory_map_ptr(struct uc_struct *uc, hwaddr begin, size_t size, uint32_t perms, void *ptr)
{
    MemoryRegion *ram = g_new(MemoryRegion, 1);

    memory_region_init_ram_ptr(uc, ram, size, ptr);
    ram->perms = perms;
    if (ram->addr == -1 || !ram->ram_block) {
        // out of memory
        g_free(ram);
        return NULL;
    }

    memory_region_add_subregion(uc->system_memory, begin, ram);

    if (uc->cpu) {
        tlb_flush(uc->cpu);
    }

    return ram;
}